

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAMCoupe.cpp
# Opt level: O0

void GetBDOSCaps(int64_t sectors,BDOS_CAPS *bdc)

{
  int iVar1;
  int *piVar2;
  int local_24;
  int local_20 [2];
  BDOS_CAPS *pBStack_18;
  int bdos_sectors;
  BDOS_CAPS *bdc_local;
  int64_t sectors_local;
  
  if (sectors != 0) {
    local_20[0] = (int)sectors;
    local_24 = 0x64001c2;
    pBStack_18 = bdc;
    bdc_local = (BDOS_CAPS *)sectors;
    piVar2 = std::min<int>(local_20,&local_24);
    iVar1 = *piVar2;
    pBStack_18->list_sectors = iVar1 / 0xc800 + 1;
    pBStack_18->base_sectors = pBStack_18->list_sectors + 1;
    pBStack_18->records = (iVar1 - pBStack_18->base_sectors) / 0x640;
    pBStack_18->extra_sectors = iVar1 - (pBStack_18->base_sectors + pBStack_18->records * 0x640);
    pBStack_18->need_byteswap = false;
    pBStack_18->bootable = false;
    pBStack_18->lba = false;
    if (4 < pBStack_18->extra_sectors / 10) {
      pBStack_18->records = pBStack_18->records + 1;
    }
  }
  return;
}

Assistant:

void GetBDOSCaps(int64_t sectors, BDOS_CAPS& bdc)
{
    if (sectors)
    {
        // Maximum BDOS sector count, to give 65535 records (53GB)
        auto bdos_sectors = std::min(static_cast<int>(sectors), 104858050);

        bdc.list_sectors = bdos_sectors / ((BDOS_SECTOR_SIZE / BDOS_LABEL_SIZE) * BDOS_RECORD_SECTORS) + 1;
        bdc.base_sectors = 1 + bdc.list_sectors;    // +1 for boot sector
        bdc.records = (bdos_sectors - bdc.base_sectors) / BDOS_RECORD_SECTORS;
        bdc.extra_sectors = bdos_sectors - (bdc.base_sectors + bdc.records * BDOS_RECORD_SECTORS);
        bdc.need_byteswap = false;
        bdc.bootable = false;
        bdc.lba = false;

        // If the final block has enough for directory plus 1 track, add it as a partial record
        if ((bdc.extra_sectors / MGT_SECTORS) >= (MGT_DIR_TRACKS + 1))
            ++bdc.records;
    }
}